

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

iterator * __thiscall
pybind11::detail::values_and_holders::find(values_and_holders *this,type_info *find_type)

{
  bool bVar1;
  value_and_holder *pvVar2;
  type_info *in_RDX;
  iterator *in_RDI;
  bool bVar3;
  iterator endit;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  iterator *this_00;
  iterator local_40;
  type_info *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  begin((values_and_holders *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  end((values_and_holders *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  while( true ) {
    bVar1 = iterator::operator!=(in_RDI,&local_40);
    bVar3 = false;
    if (bVar1) {
      pvVar2 = iterator::operator->(in_RDI);
      bVar3 = pvVar2->type != local_10;
    }
    if (!bVar3) break;
    iterator::operator++(this_00);
  }
  return this_00;
}

Assistant:

iterator find(const type_info *find_type) {
        auto it = begin(), endit = end();
        while (it != endit && it->type != find_type) ++it;
        return it;
    }